

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelSimulationDataGenerator.cpp
# Opt level: O3

U32 __thiscall
SimpleParallelSimulationDataGenerator::GenerateSimulationData
          (SimpleParallelSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channel)

{
  U32 UVar1;
  ulong uVar2;
  ulong uVar3;
  SimulationChannelDescriptor *pSVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar2 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  uVar3 = SimulationChannelDescriptor::GetCurrentSampleNumber();
  if (uVar3 < uVar2) {
    uVar6 = (int)this + 0x10;
    do {
      SimulationChannelDescriptorGroup::AdvanceAll(uVar6);
      uVar3 = (ulong)((long)(this->mData).
                            super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->mData).
                           super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3;
      if ((int)uVar3 != 0) {
        uVar5 = 0;
        do {
          SimulationChannelDescriptor::TransitionIfNeeded
                    ((BitState)
                     (this->mData).
                     super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar5]);
          uVar5 = uVar5 + 1;
        } while ((uVar3 & 0xffffffff) != uVar5);
      }
      if (this->mSettings->mClockEdge != DualEdge) {
        SimulationChannelDescriptor::Transition();
      }
      SimulationChannelDescriptorGroup::AdvanceAll(uVar6);
      SimulationChannelDescriptor::Transition();
      this->mValue = this->mValue + 1;
      uVar3 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    } while (uVar3 < uVar2);
  }
  pSVar4 = (SimulationChannelDescriptor *)SimulationChannelDescriptorGroup::GetArray();
  *simulation_channel = pSVar4;
  UVar1 = SimulationChannelDescriptorGroup::GetCount();
  return UVar1;
}

Assistant:

U32 SimpleParallelSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                                   SimulationChannelDescriptor** simulation_channel )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mClock->GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        mSimulationData.AdvanceAll( 1000 );
        U32 count = mData.size();
        for( U32 i = 0; i < count; i++ )
        {
            if( ( mDataMasks[ i ] & mValue ) == 0 )
                mData[ i ]->TransitionIfNeeded( BIT_LOW );
            else
                mData[ i ]->TransitionIfNeeded( BIT_HIGH );
        }
        if( mSettings->mClockEdge != ParallelAnalyzerClockEdge::DualEdge )
        {
            mClock->Transition();
        }

        mSimulationData.AdvanceAll( 1000 );
        mClock->Transition();

        mValue++;
    }

    *simulation_channel = mSimulationData.GetArray();
    return mSimulationData.GetCount();
}